

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test5::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test5 *this,_test_case *test_case)

{
  bool bVar1;
  _variable_type _Var2;
  ostream *poVar3;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  undefined1 local_260 [8];
  string swizzle_string;
  _swizzle_type swizzle_operator;
  uint swizzle_n_components;
  uint swizzle_component_order [4];
  undefined1 local_220 [4];
  uint n_component;
  string src_type_string;
  uint n_src_components;
  uint n_dst_components;
  string dst_type_string;
  undefined1 local_1c8 [8];
  string base_type_string;
  stringstream result;
  ostream local_198;
  _test_case *local_20;
  _test_case *test_case_local;
  GPUShaderFP64Test5 *this_local;
  
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (GPUShaderFP64Test5 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(base_type_string.field_2._M_local_buf + 8));
  _Var2 = Utils::getBaseVariableType(local_20->src_type);
  Utils::getVariableTypeString_abi_cxx11_((string *)local_1c8,(Utils *)(ulong)_Var2,type);
  Utils::getVariableTypeString_abi_cxx11_
            ((string *)&n_src_components,(Utils *)(ulong)local_20->dst_type,type_00);
  src_type_string.field_2._12_4_ = Utils::getNumberOfComponentsForVariableType(local_20->dst_type);
  src_type_string.field_2._8_4_ = Utils::getNumberOfComponentsForVariableType(local_20->src_type);
  Utils::getVariableTypeString_abi_cxx11_
            ((string *)local_220,(Utils *)(ulong)local_20->src_type,type_01);
  std::operator<<(&local_198,"#version 420\n\n");
  if (local_20->dst_type == VARIABLE_TYPE_BOOL) {
    std::operator<<(&local_198,"out int result;\n");
  }
  else {
    poVar3 = std::operator<<(&local_198,"out ");
    poVar3 = std::operator<<(poVar3,(string *)&n_src_components);
    std::operator<<(poVar3," result;\n");
  }
  if (local_20->src_type == VARIABLE_TYPE_BOOL) {
    std::operator<<(&local_198,"in int base_value;\n");
  }
  else {
    poVar3 = std::operator<<(&local_198,"in ");
    poVar3 = std::operator<<(poVar3,(string *)local_1c8);
    std::operator<<(poVar3," base_value;\n");
  }
  poVar3 = std::operator<<(&local_198,"void main()\n{\n");
  poVar3 = std::operator<<(poVar3,(string *)local_220);
  std::operator<<(poVar3," lside_value = ");
  if (local_20->src_type == VARIABLE_TYPE_BOOL) {
    poVar3 = std::operator<<(&local_198,(string *)local_220);
    std::operator<<(poVar3,"(0 != ");
  }
  else {
    poVar3 = std::operator<<(&local_198,(string *)local_220);
    std::operator<<(poVar3,"(");
  }
  if (local_20->src_type == VARIABLE_TYPE_BOOL) {
    std::operator<<(&local_198,"base_value");
  }
  else {
    for (swizzle_component_order[3] = 0;
        swizzle_component_order[3] < (uint)src_type_string.field_2._8_4_;
        swizzle_component_order[3] = swizzle_component_order[3] + 1) {
      poVar3 = std::operator<<(&local_198,"base_value + ");
      std::ostream::operator<<(poVar3,swizzle_component_order[3]);
      if (swizzle_component_order[3] != src_type_string.field_2._8_4_ - 1) {
        std::operator<<(&local_198,", ");
      }
    }
  }
  std::operator<<(&local_198,");\n");
  if (local_20->dst_type == VARIABLE_TYPE_BOOL) {
    if (local_20->type == TEST_CASE_TYPE_EXPLICIT) {
      std::operator<<(&local_198,"result = (bool(lside_value) == false) ? 0 : 1");
    }
    else {
      std::operator<<(&local_198,"result = (lside_value == false) ? 0 : 1");
    }
  }
  else if (local_20->type == TEST_CASE_TYPE_EXPLICIT) {
    poVar3 = std::operator<<(&local_198,"result = ");
    poVar3 = std::operator<<(poVar3,(string *)&n_src_components);
    std::operator<<(poVar3,"(lside_value)");
  }
  else {
    std::operator<<(&local_198,"result = lside_value");
  }
  if ((1 < (uint)src_type_string.field_2._8_4_) &&
     (bVar1 = Utils::isMatrixVariableType(local_20->src_type), !bVar1)) {
    _swizzle_operator = 0;
    swizzle_component_order[0] = 0;
    swizzle_component_order[1] = 0;
    swizzle_string.field_2._12_4_ = 0;
    swizzle_string.field_2._8_4_ =
         this->m_swizzle_matrix[src_type_string.field_2._12_4_ - 1]
         [src_type_string.field_2._8_4_ - 1];
    std::__cxx11::string::string((string *)local_260);
    getSwizzleTypeProperties
              (this,swizzle_string.field_2._8_4_,(string *)local_260,
               (uint *)(swizzle_string.field_2._M_local_buf + 0xc),&swizzle_operator);
    if (swizzle_string.field_2._12_4_ != 0) {
      poVar3 = std::operator<<(&local_198,".");
      std::operator<<(poVar3,(string *)local_260);
    }
    std::__cxx11::string::~string((string *)local_260);
  }
  std::operator<<(&local_198,";\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)&n_src_components);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(base_type_string.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test5::getVertexShaderBody(const _test_case& test_case)
{
	std::stringstream  result;
	const std::string  base_type_string = Utils::getVariableTypeString(Utils::getBaseVariableType(test_case.src_type));
	const std::string  dst_type_string  = Utils::getVariableTypeString(test_case.dst_type);
	const unsigned int n_dst_components = Utils::getNumberOfComponentsForVariableType(test_case.dst_type);
	const unsigned int n_src_components = Utils::getNumberOfComponentsForVariableType(test_case.src_type);
	const std::string  src_type_string  = Utils::getVariableTypeString(test_case.src_type);

	/* Add version preamble */
	result << "#version 420\n"
			  "\n";

	/* Declare output variables. Note that boolean output variables are not supported, so we need
	 * to handle that special case correctly */
	if (test_case.dst_type == Utils::VARIABLE_TYPE_BOOL)
	{
		result << "out int result;\n";
	}
	else
	{
		result << "out " << dst_type_string << " result;\n";
	}

	/* Declare input variables. Handle the bool case exclusively. */
	if (test_case.src_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* Use ints for bools. We will cast them to bool in the code later. */
		result << "in int base_value;\n";
	}
	else
	{
		result << "in " << base_type_string << " base_value;\n";
	}

	/* Declare main() and construct the value we will be casting from.
	 *
	 * Note: Addition operations on bool values cause an implicit conversion to int
	 *       which is not allowed. Hence, we skip these operations for this special
	 *       case.
	 */
	result << "void main()\n"
			  "{\n"
		   << src_type_string << " lside_value = ";

	if (test_case.src_type == Utils::VARIABLE_TYPE_BOOL)
	{
		result << src_type_string << "(0 != ";
	}
	else
	{
		result << src_type_string << "(";
	}

	if (test_case.src_type != Utils::VARIABLE_TYPE_BOOL)
	{
		for (unsigned int n_component = 0; n_component < n_src_components; ++n_component)
		{
			result << "base_value + " << n_component;

			if (n_component != (n_src_components - 1))
			{
				result << ", ";
			}
		} /* for (all components) */
	}
	else
	{
		DE_ASSERT(n_src_components == 1);

		result << "base_value";
	}

	result << ");\n";

	/* Perform the casting operation. Add swizzle operator if possible. */
	if (test_case.dst_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* Handle the bool case exclusively */
		if (test_case.type == TEST_CASE_TYPE_EXPLICIT)
		{
			result << "result = (bool(lside_value) == false) ? 0 : 1";
		}
		else
		{
			result << "result = (lside_value == false) ? 0 : 1";
		}
	}
	else
	{
		if (test_case.type == TEST_CASE_TYPE_EXPLICIT)
		{
			result << "result = " << dst_type_string << "(lside_value)";
		}
		else
		{
			result << "result = lside_value";
		}
	}

	if (n_src_components > 1 && !Utils::isMatrixVariableType(test_case.src_type))
	{
		/* Add a swizzle operator  */
		DE_ASSERT(n_dst_components > 0 && n_dst_components <= 4);
		DE_ASSERT(n_src_components > 0 && n_src_components <= 4);

		unsigned int  swizzle_component_order[4] = { 0 };
		unsigned int  swizzle_n_components		 = 0;
		_swizzle_type swizzle_operator			 = m_swizzle_matrix[n_dst_components - 1][n_src_components - 1];
		std::string   swizzle_string;

		getSwizzleTypeProperties(swizzle_operator, &swizzle_string, &swizzle_n_components, swizzle_component_order);

		if (swizzle_n_components > 0)
		{
			result << "." << swizzle_string;
		}
	}

	/* Close the shader implementation. */
	result << ";\n"
			  "}\n";

	return result.str();
}